

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

void * yang_read_when(lys_module *module,lys_node *node,yytokentype type,char *value)

{
  char *__ptr;
  char *pcVar1;
  LY_ERR *pLVar2;
  
  __ptr = (char *)calloc(1,0x28);
  if (__ptr == (char *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EMEM;
    __ptr = (char *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_when");
    goto LAB_0014af12;
  }
  pcVar1 = transform_schema2json(module,value);
  *(char **)__ptr = pcVar1;
  if (pcVar1 == (char *)0x0) goto switchD_0014ad8e_caseD_115;
  if ((int)type < 0x12f) {
    switch(type) {
    case AUGMENT_KEYWORD:
      if (node->next == (lys_node *)0x0) {
        node = (lys_node *)&node->next;
LAB_0014af0f:
        node->name = __ptr;
LAB_0014af12:
        free(value);
        return __ptr;
      }
      pcVar1 = "augment";
      break;
    case BASE_KEYWORD:
    case BELONGS_TO_KEYWORD:
    case BIT_KEYWORD:
    case CONFIG_KEYWORD:
    case CONTACT_KEYWORD:
      goto switchD_0014ad8e_caseD_115;
    case CASE_KEYWORD:
      if (node[1].name == (char *)0x0) {
LAB_0014af0b:
        node = node + 1;
        goto LAB_0014af0f;
      }
      pcVar1 = "case";
      break;
    case CHOICE_KEYWORD:
      if (node[1].name == (char *)0x0) goto LAB_0014af0b;
      pcVar1 = "choice";
      break;
    case CONTAINER_KEYWORD:
      if (node[1].name == (char *)0x0) goto LAB_0014af0b;
      pcVar1 = "container";
      break;
    default:
      if (type == ANYXML_KEYWORD) {
LAB_0014ae58:
        if (node[1].name == (char *)0x0) goto LAB_0014af0b;
        pcVar1 = "anydata";
        if (type == ANYXML_KEYWORD) {
          pcVar1 = "anyxml";
        }
      }
      else {
        if (type != LEAF_KEYWORD) goto switchD_0014ad8e_caseD_115;
        if (node[1].name == (char *)0x0) goto LAB_0014af0b;
        pcVar1 = "leaf";
      }
    }
  }
  else if ((int)type < 0x14e) {
    if (type == LEAF_LIST_KEYWORD) {
      if (node[1].name == (char *)0x0) goto LAB_0014af0b;
      pcVar1 = "leaflist";
    }
    else {
      if (type != LIST_KEYWORD) goto switchD_0014ad8e_caseD_115;
      if (node[1].name == (char *)0x0) goto LAB_0014af0b;
      pcVar1 = "list";
    }
  }
  else {
    if (type != USES_KEYWORD) {
      if (type == ANYDATA_KEYWORD) goto LAB_0014ae58;
      if (type != EXTENSION_INSTANCE) goto switchD_0014ad8e_caseD_115;
      goto LAB_0014af0f;
    }
    if (node[1].name == (char *)0x0) goto LAB_0014af0b;
    pcVar1 = "uses";
  }
  ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when",pcVar1);
switchD_0014ad8e_caseD_115:
  free(value);
  lydict_remove(module->ctx,*(char **)__ptr);
  free(__ptr);
  return (void *)0x0;
}

Assistant:

void *
yang_read_when(struct lys_module *module, struct lys_node *node, enum yytokentype type, char *value)
{
    struct lys_when *retval;

    retval = calloc(1, sizeof *retval);
    if (!retval) {
        LOGMEM;
        free(value);
        return NULL;
    }
    retval->cond = transform_schema2json(module, value);
    if (!retval->cond) {
        goto error;
    }
    switch (type) {
    case CONTAINER_KEYWORD:
        if (((struct lys_node_container *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "container");
            goto error;
        }
        ((struct lys_node_container *)node)->when = retval;
        break;
    case ANYDATA_KEYWORD:
    case ANYXML_KEYWORD:
        if (((struct lys_node_anydata *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", (type == ANYXML_KEYWORD) ? "anyxml" : "anydata");
            goto error;
        }
        ((struct lys_node_anydata *)node)->when = retval;
        break;
    case CHOICE_KEYWORD:
        if (((struct lys_node_choice *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "choice");
            goto error;
        }
        ((struct lys_node_choice *)node)->when = retval;
        break;
    case CASE_KEYWORD:
        if (((struct lys_node_case *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "case");
            goto error;
        }
        ((struct lys_node_case *)node)->when = retval;
        break;
    case LEAF_KEYWORD:
        if (((struct lys_node_leaf *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "leaf");
            goto error;
        }
        ((struct lys_node_leaf *)node)->when = retval;
        break;
    case LEAF_LIST_KEYWORD:
        if (((struct lys_node_leaflist *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "leaflist");
            goto error;
        }
        ((struct lys_node_leaflist *)node)->when = retval;
        break;
    case LIST_KEYWORD:
        if (((struct lys_node_list *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "list");
            goto error;
        }
        ((struct lys_node_list *)node)->when = retval;
        break;
    case USES_KEYWORD:
        if (((struct lys_node_uses *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "uses");
            goto error;
        }
        ((struct lys_node_uses *)node)->when = retval;
        break;
    case AUGMENT_KEYWORD:
        if (((struct lys_node_augment *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "augment");
            goto error;
        }
        ((struct lys_node_augment *)node)->when = retval;
        break;
    case EXTENSION_INSTANCE:
        *(struct lys_when **)node = retval;
        break;
    default:
        goto error;
        break;
    }
    free(value);
    return retval;

error:
    free(value);
    lydict_remove(module->ctx, retval->cond);
    free(retval);
    return NULL;
}